

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  FILE *pFVar3;
  char *pcVar4;
  int *piVar5;
  char *pcVar6;
  int binmode;
  int status;
  BuildCtx *ctx;
  BuildCtx ctx_;
  char **in_stack_fffffffffffff5d8;
  BuildCtx *in_stack_fffffffffffff5e0;
  undefined4 in_stack_fffffffffffff5e8;
  undefined4 in_stack_fffffffffffff5ec;
  BuildCtx *ctx_00;
  BuildCtx *in_stack_fffffffffffff620;
  BuildCtx *in_stack_fffffffffffff630;
  BuildCtx *in_stack_fffffffffffff6f0;
  BuildCtx *in_stack_fffffffffffff700;
  BuildCtx *in_stack_fffffffffffff730;
  int local_4;
  
  ctx_00 = (BuildCtx *)&stack0xfffffffffffff5f8;
  parseargs(in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
  uVar1 = build_code((BuildCtx *)CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8));
  if (uVar1 == 0) {
    if ((*ctx_00->outname == '-') && (ctx_00->outname[1] == '\0')) {
      ctx_00->fp = _stdout;
    }
    else {
      pcVar6 = "w";
      if (ctx_00->mode == BUILD_peobj || ctx_00->mode == BUILD_raw) {
        pcVar6 = "wb";
      }
      pFVar3 = fopen64(ctx_00->outname,pcVar6);
      ctx_00->fp = (FILE *)pFVar3;
      if (pFVar3 == (FILE *)0x0) {
        pcVar6 = ctx_00->outname;
        pFVar3 = _stderr;
        piVar5 = __errno_location();
        pcVar4 = strerror(*piVar5);
        fprintf(pFVar3,"Error: cannot open output file \'%s\': %s\n",pcVar6,pcVar4);
        exit(1);
      }
    }
    switch((BuildCtx *)(ulong)ctx_00->mode) {
    case (BuildCtx *)0x0:
    case (BuildCtx *)0x1:
    case (BuildCtx *)0x2:
      emit_asm(ctx_00);
      emit_asm_debug(in_stack_fffffffffffff620);
      break;
    case (BuildCtx *)0x3:
      emit_peobj(in_stack_fffffffffffff700);
      break;
    case (BuildCtx *)0x4:
      emit_raw((BuildCtx *)0x1079d9);
      break;
    case (BuildCtx *)0x5:
      emit_bcdef((BuildCtx *)(ulong)ctx_00->mode);
      emit_lib(in_stack_fffffffffffff730);
      break;
    case (BuildCtx *)0x6:
    case (BuildCtx *)0x7:
    case (BuildCtx *)0x8:
      emit_lib(in_stack_fffffffffffff730);
      break;
    case (BuildCtx *)0x9:
      emit_vmdef(in_stack_fffffffffffff630);
      emit_lib(in_stack_fffffffffffff730);
      fprintf((FILE *)ctx_00->fp,"}\n\n");
      break;
    case (BuildCtx *)0xa:
      emit_fold(in_stack_fffffffffffff6f0);
    }
    fflush((FILE *)ctx_00->fp);
    iVar2 = ferror((FILE *)ctx_00->fp);
    pFVar3 = _stderr;
    if (iVar2 != 0) {
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      fprintf(pFVar3,"Error: cannot write to output file: %s\n",pcVar6);
      exit(1);
    }
    fclose((FILE *)ctx_00->fp);
    local_4 = 0;
  }
  else {
    fprintf(_stderr,"Error: DASM error %08x\n",(ulong)uVar1);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char **argv)
{
  BuildCtx ctx_;
  BuildCtx *ctx = &ctx_;
  int status, binmode;

  if (sizeof(void *) != 4*LJ_32+8*LJ_64) {
    fprintf(stderr,"Error: pointer size mismatch in cross-build.\n");
    fprintf(stderr,"Try: make HOST_CC=\"gcc -m32\" CROSS=...\n\n");
    return 1;
  }

  UNUSED(argc);
  parseargs(ctx, argv);

  if ((status = build_code(ctx))) {
    fprintf(stderr,"Error: DASM error %08x\n", status);
    return 1;
  }

  switch (ctx->mode) {
  case BUILD_peobj:
  case BUILD_raw:
    binmode = 1;
    break;
  default:
    binmode = 0;
    break;
  }

  if (ctx->outname[0] == '-' && ctx->outname[1] == '\0') {
    ctx->fp = stdout;
#if defined(_WIN32)
    if (binmode)
      _setmode(_fileno(stdout), _O_BINARY);  /* Yuck. */
#endif
  } else if (!(ctx->fp = fopen(ctx->outname, binmode ? "wb" : "w"))) {
    fprintf(stderr, "Error: cannot open output file '%s': %s\n",
	    ctx->outname, strerror(errno));
    exit(1);
  }

  switch (ctx->mode) {
  case BUILD_elfasm:
  case BUILD_coffasm:
  case BUILD_machasm:
    emit_asm(ctx);
    emit_asm_debug(ctx);
    break;
  case BUILD_peobj:
    emit_peobj(ctx);
    break;
  case BUILD_raw:
    emit_raw(ctx);
    break;
  case BUILD_bcdef:
    emit_bcdef(ctx);
    emit_lib(ctx);
    break;
  case BUILD_vmdef:
    emit_vmdef(ctx);
    emit_lib(ctx);
    fprintf(ctx->fp, "}\n\n");
    break;
  case BUILD_ffdef:
  case BUILD_libdef:
  case BUILD_recdef:
    emit_lib(ctx);
    break;
  case BUILD_folddef:
    emit_fold(ctx);
    break;
  default:
    break;
  }

  fflush(ctx->fp);
  if (ferror(ctx->fp)) {
    fprintf(stderr, "Error: cannot write to output file: %s\n",
	    strerror(errno));
    exit(1);
  }
  fclose(ctx->fp);

  return 0;
}